

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_helper.h
# Opt level: O1

uint tLeft(vector<unsigned_int,_std::allocator<unsigned_int>_> *t,int l)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  if (-1 < l) {
    uVar2 = 0xffffffff;
    if (1 < l) {
      uVar3 = 0;
      iVar1 = 0;
      do {
        iVar4 = iVar1;
        uVar2 = (t->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        uVar3 = uVar3 + 1;
        iVar1 = iVar4 + uVar2 + 1;
      } while (l - 1 != uVar3);
      uVar2 = iVar4 + uVar2;
    }
    return uVar2;
  }
  __assert_fail("l >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sebawild[P]quickselect-integral-equation/integral_helper.h"
                ,0x62,"unsigned int tLeft(vector<unsigned int>, int)");
}

Assistant:

unsigned int tLeft(vector<unsigned int> t, int l) {
	assert(l >= 0);
	unsigned int res = 0;
	for (int i = 0; i < l-1; ++i) {
		res += t[i] + 1;
	}
	return res - 1;
}